

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O2

void __thiscall CConnman::DisconnectNodes(CConnman *this)

{
  list<CNode_*,_std::allocator<CNode_*>_> *__x;
  uint *puVar1;
  pointer ppCVar2;
  CNode *pCVar3;
  bool bVar4;
  int iVar5;
  Network NVar6;
  __normal_iterator<CNode_**,_std::vector<CNode_*,_std::allocator<CNode_*>_>_> __first;
  pointer ppCVar7;
  __off64_t *__offout;
  size_t __len;
  _List_node_base *p_Var8;
  long in_FS_OFFSET;
  string_view logging_function;
  string_view logging_function_00;
  string_view source_file;
  string_view source_file_00;
  uint in_stack_fffffffffffffef8;
  CNode *pnode;
  vector<CNode_*,_std::allocator<CNode_*>_> nodes_copy;
  list<CConnman::ReconnectionInfo,_std::allocator<CConnman::ReconnectionInfo>_> reconnections_to_add
  ;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock62;
  list<CNode_*,_std::allocator<CNode_*>_> nodes_disconnected_copy;
  string local_60 [32];
  ConnectionType local_40;
  bool local_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  reconnections_to_add.
  super__List_base<CConnman::ReconnectionInfo,_std::allocator<CConnman::ReconnectionInfo>_>._M_impl.
  _M_node.super__List_node_base._M_next = (_List_node_base *)&reconnections_to_add;
  reconnections_to_add.
  super__List_base<CConnman::ReconnectionInfo,_std::allocator<CConnman::ReconnectionInfo>_>._M_impl.
  _M_node._M_size = 0;
  reconnections_to_add.
  super__List_base<CConnman::ReconnectionInfo,_std::allocator<CConnman::ReconnectionInfo>_>._M_impl.
  _M_node.super__List_node_base._M_prev =
       reconnections_to_add.
       super__List_base<CConnman::ReconnectionInfo,_std::allocator<CConnman::ReconnectionInfo>_>.
       _M_impl._M_node.super__List_node_base._M_next;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            (&criticalblock62,&this->m_nodes_mutex,"m_nodes_mutex",
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/net.cpp",
             0x74e,false);
  if (((this->fNetworkActive)._M_base._M_i & 1U) == 0) {
    ppCVar2 = (this->m_nodes).super__Vector_base<CNode_*,_std::allocator<CNode_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    for (ppCVar7 = (this->m_nodes).super__Vector_base<CNode_*,_std::allocator<CNode_*>_>._M_impl.
                   super__Vector_impl_data._M_start; ppCVar7 != ppCVar2; ppCVar7 = ppCVar7 + 1) {
      pCVar3 = *ppCVar7;
      if (((pCVar3->fDisconnect)._M_base._M_i & 1U) == 0) {
        bVar4 = ::LogAcceptCategory(NET,Debug);
        if (bVar4) {
          nodes_disconnected_copy.super__List_base<CNode_*,_std::allocator<CNode_*>_>._M_impl.
          _M_node.super__List_node_base._M_next = (_List_node_base *)pCVar3->id;
          logging_function_00._M_str = "DisconnectNodes";
          logging_function_00._M_len = 0xf;
          source_file_00._M_str =
               "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/net.cpp";
          source_file_00._M_len = 0x50;
          LogPrintf_<long>(logging_function_00,source_file_00,0x754,NET,Debug,
                           "Network not active, dropping peer=%d\n",(long *)&nodes_disconnected_copy
                          );
        }
        LOCK();
        (pCVar3->fDisconnect)._M_base._M_i = true;
        UNLOCK();
      }
    }
  }
  std::vector<CNode_*,_std::allocator<CNode_*>_>::vector(&nodes_copy,&this->m_nodes);
  __x = &this->m_nodes_disconnected;
  for (ppCVar7 = nodes_copy.super__Vector_base<CNode_*,_std::allocator<CNode_*>_>._M_impl.
                 super__Vector_impl_data._M_start;
      ppCVar7 !=
      nodes_copy.super__Vector_base<CNode_*,_std::allocator<CNode_*>_>._M_impl.
      super__Vector_impl_data._M_finish; ppCVar7 = ppCVar7 + 1) {
    pnode = *ppCVar7;
    if (((pnode->fDisconnect)._M_base._M_i & 1U) != 0) {
      __first = std::
                __remove_if<__gnu_cxx::__normal_iterator<CNode**,std::vector<CNode*,std::allocator<CNode*>>>,__gnu_cxx::__ops::_Iter_equals_val<CNode*const>>
                          ((__normal_iterator<CNode_**,_std::vector<CNode_*,_std::allocator<CNode_*>_>_>
                            )(this->m_nodes).super__Vector_base<CNode_*,_std::allocator<CNode_*>_>.
                             _M_impl.super__Vector_impl_data._M_start,
                           (__normal_iterator<CNode_**,_std::vector<CNode_*,_std::allocator<CNode_*>_>_>
                            )(this->m_nodes).super__Vector_base<CNode_*,_std::allocator<CNode_*>_>.
                             _M_impl.super__Vector_impl_data._M_finish,&pnode);
      std::vector<CNode_*,_std::allocator<CNode_*>_>::erase
                (&this->m_nodes,(const_iterator)__first._M_current,
                 (const_iterator)
                 (this->m_nodes).super__Vector_base<CNode_*,_std::allocator<CNode_*>_>._M_impl.
                 super__Vector_impl_data._M_finish);
      iVar5 = (*((pnode->m_transport)._M_t.
                 super___uniq_ptr_impl<Transport,_std::default_delete<Transport>_>._M_t.
                 super__Tuple_impl<0UL,_Transport_*,_std::default_delete<Transport>_>.
                 super__Head_base<0UL,_Transport_*,_false>._M_head_impl)->_vptr_Transport[10])();
      if ((char)iVar5 != '\0') {
        CAddress::CAddress((CAddress *)&nodes_disconnected_copy,&pnode->addr);
        (pnode->grantOutbound).fHaveGrant = false;
        (pnode->grantOutbound).sem = (CSemaphore *)0x0;
        std::__cxx11::string::string(local_60,&pnode->m_dest);
        local_40 = pnode->m_conn_type;
        local_3c = false;
        std::__cxx11::list<CConnman::ReconnectionInfo,_std::allocator<CConnman::ReconnectionInfo>_>
        ::push_back(&reconnections_to_add,(ReconnectionInfo *)&nodes_disconnected_copy);
        ReconnectionInfo::~ReconnectionInfo((ReconnectionInfo *)&nodes_disconnected_copy);
        bVar4 = ::LogAcceptCategory(NET,Debug);
        if (bVar4) {
          nodes_disconnected_copy.super__List_base<CNode_*,_std::allocator<CNode_*>_>._M_impl.
          _M_node.super__List_node_base._M_next = (_List_node_base *)pnode->id;
          logging_function._M_str = "DisconnectNodes";
          logging_function._M_len = 0xf;
          source_file._M_str =
               "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/net.cpp";
          source_file._M_len = 0x50;
          LogPrintf_<long>(logging_function,source_file,0x76d,NET,Debug,
                           "retrying with v1 transport protocol for peer=%d\n",
                           (long *)&nodes_disconnected_copy);
        }
      }
      CSemaphoreGrant::Release(&pnode->grantOutbound);
      CNode::CloseSocketDisconnect(pnode);
      bVar4 = CNode::IsManualOrFullOutboundConn(pnode);
      if (bVar4) {
        NVar6 = CNetAddr::GetNetwork((CNetAddr *)&pnode->addr);
        puVar1 = (this->m_network_conn_counts)._M_elems + NVar6;
        *puVar1 = *puVar1 - 1;
      }
      LOCK();
      (pnode->nRefCount).super___atomic_base<int>._M_i =
           (pnode->nRefCount).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      std::__cxx11::list<CNode_*,_std::allocator<CNode_*>_>::push_back(__x,&pnode);
    }
  }
  std::_Vector_base<CNode_*,_std::allocator<CNode_*>_>::~_Vector_base
            (&nodes_copy.super__Vector_base<CNode_*,_std::allocator<CNode_*>_>);
  std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock62.super_unique_lock);
  std::__cxx11::list<CNode_*,_std::allocator<CNode_*>_>::list(&nodes_disconnected_copy,__x);
  p_Var8 = (_List_node_base *)&nodes_disconnected_copy;
  while (p_Var8 = (((_List_base<CNode_*,_std::allocator<CNode_*>_> *)&p_Var8->_M_next)->_M_impl).
                  _M_node.super__List_node_base._M_next,
        p_Var8 != (_List_node_base *)&nodes_disconnected_copy) {
    nodes_copy.super__Vector_base<CNode_*,_std::allocator<CNode_*>_>._M_impl.super__Vector_impl_data
    ._M_start = (pointer)p_Var8[1]._M_next;
    iVar5 = CNode::GetRefCount((CNode *)nodes_copy.
                                        super__Vector_base<CNode_*,_std::allocator<CNode_*>_>.
                                        _M_impl.super__Vector_impl_data._M_start);
    if (iVar5 < 1) {
      std::__cxx11::list<CNode_*,_std::allocator<CNode_*>_>::remove(__x,(char *)&nodes_copy);
      DeleteNode(this,(CNode *)nodes_copy.super__Vector_base<CNode_*,_std::allocator<CNode_*>_>.
                               _M_impl.super__Vector_impl_data._M_start);
    }
  }
  std::__cxx11::_List_base<CNode_*,_std::allocator<CNode_*>_>::_M_clear
            (&nodes_disconnected_copy.super__List_base<CNode_*,_std::allocator<CNode_*>_>);
  iVar5 = 0x69b9d1;
  __offout = (__off64_t *)0x78d;
  __len = 0;
  UniqueLock<AnnotatedMixin<std::mutex>_>::UniqueLock
            ((UniqueLock<AnnotatedMixin<std::mutex>_> *)&nodes_disconnected_copy,
             &this->m_reconnections_mutex,"m_reconnections_mutex",
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/net.cpp",
             0x78d,false);
  std::__cxx11::list<CConnman::ReconnectionInfo,_std::allocator<CConnman::ReconnectionInfo>_>::
  splice(&this->m_reconnections,(int)&this->m_reconnections,
         (__off64_t *)
         &reconnections_to_add.
          super__List_base<CConnman::ReconnectionInfo,_std::allocator<CConnman::ReconnectionInfo>_>,
         iVar5,__offout,__len,in_stack_fffffffffffffef8);
  std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)&nodes_disconnected_copy);
  std::__cxx11::_List_base<CConnman::ReconnectionInfo,_std::allocator<CConnman::ReconnectionInfo>_>
  ::_M_clear(&reconnections_to_add.
              super__List_base<CConnman::ReconnectionInfo,_std::allocator<CConnman::ReconnectionInfo>_>
            );
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CConnman::DisconnectNodes()
{
    AssertLockNotHeld(m_nodes_mutex);
    AssertLockNotHeld(m_reconnections_mutex);

    // Use a temporary variable to accumulate desired reconnections, so we don't need
    // m_reconnections_mutex while holding m_nodes_mutex.
    decltype(m_reconnections) reconnections_to_add;

    {
        LOCK(m_nodes_mutex);

        if (!fNetworkActive) {
            // Disconnect any connected nodes
            for (CNode* pnode : m_nodes) {
                if (!pnode->fDisconnect) {
                    LogDebug(BCLog::NET, "Network not active, dropping peer=%d\n", pnode->GetId());
                    pnode->fDisconnect = true;
                }
            }
        }

        // Disconnect unused nodes
        std::vector<CNode*> nodes_copy = m_nodes;
        for (CNode* pnode : nodes_copy)
        {
            if (pnode->fDisconnect)
            {
                // remove from m_nodes
                m_nodes.erase(remove(m_nodes.begin(), m_nodes.end(), pnode), m_nodes.end());

                // Add to reconnection list if appropriate. We don't reconnect right here, because
                // the creation of a connection is a blocking operation (up to several seconds),
                // and we don't want to hold up the socket handler thread for that long.
                if (pnode->m_transport->ShouldReconnectV1()) {
                    reconnections_to_add.push_back({
                        .addr_connect = pnode->addr,
                        .grant = std::move(pnode->grantOutbound),
                        .destination = pnode->m_dest,
                        .conn_type = pnode->m_conn_type,
                        .use_v2transport = false});
                    LogDebug(BCLog::NET, "retrying with v1 transport protocol for peer=%d\n", pnode->GetId());
                }

                // release outbound grant (if any)
                pnode->grantOutbound.Release();

                // close socket and cleanup
                pnode->CloseSocketDisconnect();

                // update connection count by network
                if (pnode->IsManualOrFullOutboundConn()) --m_network_conn_counts[pnode->addr.GetNetwork()];

                // hold in disconnected pool until all refs are released
                pnode->Release();
                m_nodes_disconnected.push_back(pnode);
            }
        }
    }
    {
        // Delete disconnected nodes
        std::list<CNode*> nodes_disconnected_copy = m_nodes_disconnected;
        for (CNode* pnode : nodes_disconnected_copy)
        {
            // Destroy the object only after other threads have stopped using it.
            if (pnode->GetRefCount() <= 0) {
                m_nodes_disconnected.remove(pnode);
                DeleteNode(pnode);
            }
        }
    }
    {
        // Move entries from reconnections_to_add to m_reconnections.
        LOCK(m_reconnections_mutex);
        m_reconnections.splice(m_reconnections.end(), std::move(reconnections_to_add));
    }
}